

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *__s;
  ostream *poVar6;
  __errfunc *in_RCX;
  int __flags;
  int __flags_00;
  ulong uVar7;
  char *pcVar8;
  glob_t *in_R8;
  glob glob;
  allocator local_71;
  string local_70;
  ulong local_50;
  char **local_48;
  glob local_40;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar8 = *argv;
    sVar4 = strlen(pcVar8);
    pcVar5 = pcVar8 + sVar4;
    while (__s = pcVar5, pcVar5 = __s + -1, pcVar8 < pcVar5) {
      if ((*pcVar5 == '/') || (*pcVar5 == '\\')) goto LAB_0010242b;
    }
    if (pcVar5 == (char *)0xffffffffffffffff) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1060d8);
      goto LAB_00102448;
    }
LAB_0010242b:
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
LAB_00102448:
    local_70._M_dataplus._M_p._0_1_ = 0x20;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_70,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"pattern1 [pattern2 [...]]",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar3 = 1;
  }
  else {
    local_50 = (ulong)(uint)argc;
    uVar7 = 1;
    local_48 = argv;
    do {
      std::__cxx11::string::string((string *)&local_70,local_48[uVar7],&local_71);
      ::glob::glob::glob(&local_40,(char *)&local_70,__flags,in_RCX,in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      pcVar8 = (char *)0x1;
      ::glob::glob::use_full_paths(&local_40,true);
      while (bVar1 = ::glob::glob::is_valid(&local_40), bVar1) {
        ::glob::glob::current_match_abi_cxx11_(&local_70,&local_40);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                             local_70._M_dataplus._M_p._0_1_),
                            local_70._M_string_length);
        cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        pcVar8 = (char *)(ulong)(uint)(int)cVar2;
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
            &local_70.field_2) {
          pcVar8 = (char *)(local_70.field_2._M_allocated_capacity + 1);
          operator_delete((undefined1 *)
                          CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_),
                          (ulong)pcVar8);
        }
        ::glob::glob::next(&local_40);
      }
      ::glob::glob::~glob(&local_40,pcVar8,__flags_00,in_RCX,in_R8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_50);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        std::cerr
            << "Usage: " << get_base_name(argv[0]) << ' '
            << "pattern1 [pattern2 [...]]"
            << std::endl;
        return 1;
    }
    for (int i = 1; i < argc; i++) {
        glob::glob glob(argv[i]);
        glob.use_full_paths(true);
        while (glob) {
            std::cout << glob.current_match() << std::endl;
            glob.next();
        }
    }
    return 0;
}